

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_2>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_4,_2>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  Vector<float,_4> *pVVar1;
  Precision PVar2;
  Precision extraout_EDX;
  Precision extraout_EDX_00;
  Value *this_00;
  long lVar3;
  float fVar4;
  
  PVar2 = (Precision)fmt;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 1.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 1.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  lVar3 = -4;
  this_00 = __return_storage_ptr__;
  do {
    fVar4 = DefaultSampling<float>::genRandom((DefaultSampling<float> *)this_00,fmt,PVar2,rnd);
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar3] = fVar4;
    fVar4 = DefaultSampling<float>::genRandom
                      ((DefaultSampling<float> *)this_00,fmt,extraout_EDX,rnd);
    __return_storage_ptr__[1].m_data.m_data[0].m_data[lVar3] = fVar4;
    lVar3 = lVar3 + 1;
    PVar2 = extraout_EDX_00;
  } while (lVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}